

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void visible_cb(Fl_Light_Button *i,void *v)

{
  char cVar1;
  Fl_Widget_Type *this;
  Fl_Type *pFVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Fl_Widget_Type *q;
  Fl_Type **ppFVar5;
  
  if ((char *)v == "LOAD") {
    Fl_Button::value(&i->super_Fl_Button,(uint)((current_widget->o->flags_ & 2) == 0));
    iVar4 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
    if (iVar4 != 0) {
      Fl_Widget::deactivate((Fl_Widget *)i);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)i);
    return;
  }
  cVar1 = (i->super_Fl_Button).value_;
  bVar3 = false;
  ppFVar5 = &Fl_Type::first;
  do {
    this = (Fl_Widget_Type *)*ppFVar5;
    if (this == (Fl_Widget_Type *)0x0) {
      if (bVar3) {
        set_modflag(1);
        return;
      }
      return;
    }
    if ((this->super_Fl_Type).selected != '\0') {
      iVar4 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this);
      if (iVar4 != 0) {
        (*this->o->_vptr_Fl_Widget[(ulong)(cVar1 == '\0') + 5])();
        Fl_Widget_Type::redraw(this);
        bVar3 = true;
        if (cVar1 != '\0') {
          pFVar2 = (this->super_Fl_Type).parent;
          bVar3 = true;
          if (pFVar2 != (Fl_Type *)0x0) {
            iVar4 = (*pFVar2->_vptr_Fl_Type[5])();
            bVar3 = true;
            if (CONCAT44(extraout_var,iVar4) != 0) {
              iVar4 = (*((this->super_Fl_Type).parent)->_vptr_Fl_Type[5])();
              iVar4 = strcmp((char *)CONCAT44(extraout_var_00,iVar4),"Fl_Tabs");
              if (iVar4 == 0) {
                Fl_Tabs::value((Fl_Tabs *)this->o->parent_,this->o);
              }
              else {
                iVar4 = (*((this->super_Fl_Type).parent)->_vptr_Fl_Type[5])();
                iVar4 = strcmp((char *)CONCAT44(extraout_var_01,iVar4),"Fl_Wizard");
                bVar3 = true;
                if (iVar4 != 0) goto LAB_00185b54;
                Fl_Wizard::value((Fl_Wizard *)this->o->parent_,this->o);
              }
              bVar3 = true;
            }
          }
        }
      }
    }
LAB_00185b54:
    ppFVar5 = &(this->super_Fl_Type).next;
  } while( true );
}

Assistant:

void visible_cb(Fl_Light_Button* i, void* v) {
  if (v == LOAD) {
    i->value(current_widget->o->visible());
    if (current_widget->is_window()) i->deactivate();
    else i->activate();
  } else {
    int mod = 0;
    int n = i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	n ? q->o->show() : q->o->hide();
	q->redraw();
	mod = 1;
	if (n && q->parent && q->parent->type_name()) {
	  if (!strcmp(q->parent->type_name(), "Fl_Tabs")) {
	    ((Fl_Tabs *)q->o->parent())->value(q->o);
	  } else if (!strcmp(q->parent->type_name(), "Fl_Wizard")) {
	    ((Fl_Wizard *)q->o->parent())->value(q->o);
	  }
	}
      }
    }
    if (mod) set_modflag(1);
  }
}